

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

statusline checkhttpprefix(Curl_easy *data,char *s,size_t len)

{
  curl_slist *pcVar1;
  char *__s;
  int iVar2;
  statusline sVar3;
  size_t max;
  size_t max_00;
  statusline sVar4;
  
  pcVar1 = (data->set).http200aliases;
  sVar4 = STATUS_BAD;
  do {
    if (pcVar1 == (curl_slist *)0x0) {
LAB_00600607:
      max_00 = 5;
      if (len < 5) {
        max_00 = len;
      }
      iVar2 = curl_strnequal("HTTP/",s,max_00);
      sVar3 = (uint)(4 < len);
      if (iVar2 == 0) {
        sVar3 = sVar4;
      }
      return sVar3;
    }
    __s = pcVar1->data;
    max = strlen(__s);
    if (len <= max) {
      max = len;
    }
    iVar2 = curl_strnequal(__s,s,max);
    if (iVar2 != 0) {
      sVar4 = STATUS_UNKNOWN;
      if (4 < len) {
        return STATUS_DONE;
      }
      goto LAB_00600607;
    }
    pcVar1 = pcVar1->next;
  } while( true );
}

Assistant:

static statusline
checkhttpprefix(struct Curl_easy *data,
                const char *s, size_t len)
{
  struct curl_slist *head = data->set.http200aliases;
  statusline rc = STATUS_BAD;
  statusline onmatch = len >= 5? STATUS_DONE : STATUS_UNKNOWN;

  while(head) {
    if(checkprefixmax(head->data, s, len)) {
      rc = onmatch;
      break;
    }
    head = head->next;
  }

  if((rc != STATUS_DONE) && (checkprefixmax("HTTP/", s, len)))
    rc = onmatch;

  return rc;
}